

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,int num_digits,string_view prefix,
          format_specs specs,num_writer f)

{
  int in_ESI;
  int in_stack_00000008;
  int in_stack_0000000c;
  byte in_stack_00000011;
  type unsiged_width;
  size_t padding;
  char_type fill;
  size_t size;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  *in_stack_ffffffffffffff80;
  format_specs *in_stack_ffffffffffffff88;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffff90;
  basic_string_view<char> local_10;
  
  basic_string_view<char>::size(&local_10);
  to_unsigned<int>(in_ESI);
  fill_t<wchar_t>::operator[]((fill_t<wchar_t> *)&stack0x00000014,0);
  if ((in_stack_00000011 & 0xf) == 4) {
    to_unsigned<int>(in_stack_00000008);
  }
  else if (in_ESI < in_stack_0000000c) {
    basic_string_view<char>::size(&local_10);
    to_unsigned<int>(in_stack_0000000c);
    to_unsigned<int>(in_stack_0000000c - in_ESI);
  }
  if ((in_stack_00000011 & 0xf) == 0) {
    in_stack_00000011 = in_stack_00000011 & 0xf0 | 2;
  }
  memcpy(&stack0xffffffffffffff88,&stack0x00000028,0x24);
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }